

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactShape.cpp
# Opt level: O0

void __thiscall
btGImpactMeshShapePart::processAllTrianglesRay
          (btGImpactMeshShapePart *this,btTriangleCallback *callback,btVector3 *rayFrom,
          btVector3 *rayTo)

{
  int iVar1;
  int *piVar2;
  long *in_RSI;
  btGImpactMeshShapePart *in_RDI;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  btVector3 bVar3;
  int i;
  btPrimitiveTriangle triangle;
  int part;
  btVector3 rayDir;
  btAlignedObjectArray<int> collided;
  long *in_stack_fffffffffffffee8;
  int index;
  btGImpactShapeInterface *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  btScalar bVar4;
  btPrimitiveTriangle *in_stack_ffffffffffffff00;
  undefined1 auVar5 [16];
  btGImpactQuantizedBvh *this_00;
  int local_b0;
  undefined1 local_ac [108];
  btAlignedObjectArray<int> local_40;
  long *local_10;
  
  local_10 = in_RSI;
  (*(in_RDI->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
    _vptr_btCollisionShape[0x1c])();
  btAlignedObjectArray<int>::btAlignedObjectArray
            ((btAlignedObjectArray<int> *)in_stack_fffffffffffffef0);
  bVar3 = operator-(in_stack_ffffffffffffff00->m_vertices,
                    (btVector3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_ac._100_8_ = bVar3.m_floats._8_8_;
  auVar5._8_4_ = in_XMM1_Dc;
  auVar5._0_8_ = local_ac._100_8_;
  auVar5._12_4_ = in_XMM1_Dd;
  local_ac._92_8_ = bVar3.m_floats._0_8_;
  this_00 = (btGImpactQuantizedBvh *)local_ac._92_8_;
  btVector3::normalize((btVector3 *)in_stack_fffffffffffffef0);
  btGImpactQuantizedBvh::rayQuery
            (this_00,auVar5._8_8_,auVar5._0_8_,(btAlignedObjectArray<int> *)in_RDI);
  iVar1 = btAlignedObjectArray<int>::size(&local_40);
  if (iVar1 == 0) {
    (*(in_RDI->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0x1d])();
    local_ac._76_4_ = 1.4013e-45;
  }
  else {
    local_ac._72_4_ = getPart(in_RDI);
    btPrimitiveTriangle::btPrimitiveTriangle(in_stack_ffffffffffffff00);
    local_b0 = btAlignedObjectArray<int>::size(&local_40);
    while( true ) {
      index = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      iVar1 = local_b0 + -1;
      if (local_b0 == 0) break;
      btAlignedObjectArray<int>::operator[](&local_40,iVar1);
      btGImpactShapeInterface::getPrimitiveTriangle
                (in_stack_fffffffffffffef0,index,(btPrimitiveTriangle *)0x1d801c);
      in_stack_fffffffffffffef0 = (btGImpactShapeInterface *)local_ac;
      in_stack_fffffffffffffee8 = local_10;
      bVar4 = (btScalar)local_ac._72_4_;
      piVar2 = btAlignedObjectArray<int>::operator[](&local_40,iVar1);
      (**(code **)(*in_stack_fffffffffffffee8 + 0x10))
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffef0,bVar4,*piVar2);
      local_b0 = iVar1;
    }
    (*(in_RDI->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0x1d])();
    local_ac._76_4_ = 0.0;
  }
  btAlignedObjectArray<int>::~btAlignedObjectArray((btAlignedObjectArray<int> *)0x1d80a6);
  return;
}

Assistant:

void btGImpactMeshShapePart::processAllTrianglesRay(btTriangleCallback* callback,const btVector3& rayFrom, const btVector3& rayTo) const
{
	lockChildShapes();

	btAlignedObjectArray<int> collided;
	btVector3 rayDir(rayTo - rayFrom);
	rayDir.normalize();
	m_box_set.rayQuery(rayDir, rayFrom, collided);

	if(collided.size()==0)
	{
		unlockChildShapes();
		return;
	}

	int part = (int)getPart();
	btPrimitiveTriangle triangle;
	int i = collided.size();
	while(i--)
	{
		getPrimitiveTriangle(collided[i],triangle);
		callback->processTriangle(triangle.m_vertices,part,collided[i]);
	}
	unlockChildShapes();
}